

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O2

bool __thiscall crnlib::ktx_texture::compute_pixel_info(ktx_texture *this)

{
  uint32 ogl_type;
  uint32 ogl_fmt;
  bool bVar1;
  
  ogl_type = (this->m_header).m_glType;
  ogl_fmt = (this->m_header).m_glFormat;
  if (ogl_type == 0) {
    if (ogl_fmt == 0) {
      bVar1 = get_ogl_fmt_desc((this->m_header).m_glInternalFormat,0,&this->m_block_dim,
                               &this->m_bytes_per_block);
      if (bVar1) {
        if (this->m_block_dim != 1) {
          return true;
        }
      }
      else if ((((this->m_header).m_glType == 0 && (this->m_header).m_glInternalFormat == 0) &&
               ((this->m_header).m_glTypeSize == 0)) &&
              ((this->m_header).m_glBaseInternalFormat == 0)) {
        console::warning(
                        "ktx_texture::compute_pixel_info: Header doesn\'t specify any format, assuming ETC1 and hoping for the best"
                        );
        (this->m_header).m_glInternalFormat = 0x8d64;
        (this->m_header).m_glBaseInternalFormat = 0x1907;
        (this->m_header).m_glTypeSize = 1;
        this->m_block_dim = 4;
        this->m_bytes_per_block = 8;
        return true;
      }
    }
  }
  else if (ogl_fmt != 0) {
    bVar1 = get_ogl_fmt_desc(ogl_fmt,ogl_type,&this->m_block_dim,&this->m_bytes_per_block);
    if (!bVar1) {
      return false;
    }
    if (this->m_block_dim < 2) {
      return true;
    }
    return false;
  }
  return false;
}

Assistant:

bool ktx_texture::compute_pixel_info()
    {
        if ((!m_header.m_glType) || (!m_header.m_glFormat))
        {
            if ((m_header.m_glType) || (m_header.m_glFormat))
            {
                return false;
            }

            // Must be a compressed format.
            if (!get_ogl_fmt_desc(m_header.m_glInternalFormat, m_header.m_glType, m_block_dim, m_bytes_per_block))
            {
#if CRNLIB_KTX_PVRTEX_WORKAROUNDS
                if ((!m_header.m_glInternalFormat) && (!m_header.m_glType) && (!m_header.m_glTypeSize) && (!m_header.m_glBaseInternalFormat))
                {
                    // PVRTexTool writes bogus headers when outputting ETC1.
                    console::warning("ktx_texture::compute_pixel_info: Header doesn't specify any format, assuming ETC1 and hoping for the best");
                    m_header.m_glBaseInternalFormat = KTX_RGB;
                    m_header.m_glInternalFormat = KTX_ETC1_RGB8_OES;
                    m_header.m_glTypeSize = 1;
                    m_block_dim = 4;
                    m_bytes_per_block = 8;
                    return true;
                }
#endif
                return false;
            }

            if (m_block_dim == 1)
            {
                return false;
            }
        }
        else
        {
            // Must be an uncompressed format.
            if (!get_ogl_fmt_desc(m_header.m_glFormat, m_header.m_glType, m_block_dim, m_bytes_per_block))
            {
                return false;
            }

            if (m_block_dim > 1)
            {
                return false;
            }
        }
        return true;
    }